

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

void __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::iterator_base<true>::iterator_base(iterator_base<true> *this,iterator_base<true> *other)

{
  iterator_base<true> *other_local;
  iterator_base<true> *this_local;
  
  this->db_ = other->db_;
  memcpy(&this->visited_parents_,&other->visited_parents_,0xd8);
  this->index_ = other->index_;
  std::
  unique_ptr<std::pair<pstore::uint128_const,pstore::extent<unsigned_char>>,std::default_delete<std::pair<pstore::uint128_const,pstore::extent<unsigned_char>>>>
  ::
  unique_ptr<std::default_delete<std::pair<pstore::uint128_const,pstore::extent<unsigned_char>>>,void>
            ((unique_ptr<std::pair<pstore::uint128_const,pstore::extent<unsigned_char>>,std::default_delete<std::pair<pstore::uint128_const,pstore::extent<unsigned_char>>>>
              *)&this->pos_);
  std::
  unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
  ::reset(&this->pos_,(pointer)0x0);
  return;
}

Assistant:

iterator_base (iterator_base const & other) noexcept
                        : db_{other.db_}
                        , visited_parents_ (other.visited_parents_)
                        , index_ (other.index_) {
                    pos_.reset ();
                }